

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinition.cpp
# Opt level: O0

bool deqp::gles31::Functional::ProgramInterfaceDefinition::isIllegalVertexOutput
               (VarType *varType,bool insideAStruct,bool insideAnArray)

{
  bool bVar1;
  DataType DVar2;
  int iVar3;
  StructType *pSVar4;
  StructMember *this;
  VarType *pVVar5;
  byte local_21;
  int local_20;
  int ndx;
  bool isOpaqueType;
  bool insideAnArray_local;
  bool insideAStruct_local;
  VarType *varType_local;
  
  bVar1 = glu::VarType::isBasicType(varType);
  if (bVar1) {
    DVar2 = glu::VarType::getBasicType(varType);
    bVar1 = glu::isDataTypeScalar(DVar2);
    local_21 = 0;
    if (!bVar1) {
      DVar2 = glu::VarType::getBasicType(varType);
      bVar1 = glu::isDataTypeVector(DVar2);
      local_21 = 0;
      if (!bVar1) {
        DVar2 = glu::VarType::getBasicType(varType);
        bVar1 = glu::isDataTypeMatrix(DVar2);
        local_21 = bVar1 ^ 0xff;
      }
    }
    DVar2 = glu::VarType::getBasicType(varType);
    bVar1 = glu::isDataTypeBoolOrBVec(DVar2);
    if (bVar1) {
      varType_local._7_1_ = true;
    }
    else if ((local_21 & 1) == 0) {
      varType_local._7_1_ = false;
    }
    else {
      varType_local._7_1_ = true;
    }
  }
  else {
    bVar1 = glu::VarType::isArrayType(varType);
    if (bVar1) {
      if ((insideAnArray) || (insideAStruct)) {
        varType_local._7_1_ = true;
      }
      else {
        pVVar5 = glu::VarType::getElementType(varType);
        varType_local._7_1_ = isIllegalVertexOutput(pVVar5,insideAStruct,true);
      }
    }
    else {
      bVar1 = glu::VarType::isStructType(varType);
      if (bVar1) {
        if ((insideAnArray) || (insideAStruct)) {
          varType_local._7_1_ = true;
        }
        else {
          local_20 = 0;
          while( true ) {
            pSVar4 = glu::VarType::getStructPtr(varType);
            iVar3 = glu::StructType::getNumMembers(pSVar4);
            if (iVar3 <= local_20) break;
            pSVar4 = glu::VarType::getStructPtr(varType);
            this = glu::StructType::getMember(pSVar4,local_20);
            pVVar5 = glu::StructMember::getType(this);
            bVar1 = isIllegalVertexOutput(pVVar5,true,insideAnArray);
            if (bVar1) {
              return true;
            }
            local_20 = local_20 + 1;
          }
          varType_local._7_1_ = false;
        }
      }
      else {
        varType_local._7_1_ = true;
      }
    }
  }
  return varType_local._7_1_;
}

Assistant:

static bool isIllegalVertexOutput (const glu::VarType& varType, bool insideAStruct = false, bool insideAnArray = false)
{
	// booleans, opaque types, arrays of arrays, arrays of structs, array in struct, struct struct are not allowed as vertex outputs

	if (varType.isBasicType())
	{
		const bool isOpaqueType = !glu::isDataTypeScalar(varType.getBasicType()) && !glu::isDataTypeVector(varType.getBasicType()) && !glu::isDataTypeMatrix(varType.getBasicType());

		if (glu::isDataTypeBoolOrBVec(varType.getBasicType()))
			return true;

		if (isOpaqueType)
			return true;

		return false;
	}
	else if (varType.isArrayType())
	{
		if (insideAnArray || insideAStruct)
			return true;

		return isIllegalVertexOutput(varType.getElementType(), insideAStruct, true);
	}
	else if (varType.isStructType())
	{
		if (insideAnArray || insideAStruct)
			return true;

		for (int ndx = 0; ndx < varType.getStructPtr()->getNumMembers(); ++ndx)
			if (isIllegalVertexOutput(varType.getStructPtr()->getMember(ndx).getType(), true, insideAnArray))
				return true;

		return false;
	}
	else
	{
		DE_ASSERT(false);
		return true;
	}
}